

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O0

Fl_Type * __thiscall Fl_Data_Type::make(Fl_Data_Type *this)

{
  int iVar1;
  Fl_Data_Type *this_00;
  bool bVar2;
  Fl_Data_Type *o;
  Fl_Type *p;
  Fl_Data_Type *this_local;
  
  o = (Fl_Data_Type *)Fl_Type::current;
  while( true ) {
    bVar2 = false;
    if (o != (Fl_Data_Type *)0x0) {
      iVar1 = (*(o->super_Fl_Decl_Type).super_Fl_Type._vptr_Fl_Type[0x24])();
      bVar2 = iVar1 == 0;
    }
    if (!bVar2) break;
    o = (Fl_Data_Type *)(o->super_Fl_Decl_Type).super_Fl_Type.parent;
  }
  this_00 = (Fl_Data_Type *)operator_new(0x88);
  Fl_Data_Type(this_00);
  (this_00->super_Fl_Decl_Type).public_ = '\x01';
  (this_00->super_Fl_Decl_Type).static_ = '\x01';
  this_00->filename_ = (char *)0x0;
  Fl_Type::name((Fl_Type *)this_00,"myBinaryData");
  Fl_Type::add((Fl_Type *)this_00,(Fl_Type *)o);
  (this_00->super_Fl_Decl_Type).super_Fl_Type.factory = (Fl_Type *)this;
  return (Fl_Type *)this_00;
}

Assistant:

Fl_Type *Fl_Data_Type::make() {
  Fl_Type *p = Fl_Type::current;
  while (p && !p->is_decl_block()) p = p->parent;
  Fl_Data_Type *o = new Fl_Data_Type();
  o->public_ = 1;
  o->static_ = 1;
  o->filename_ = 0;
  o->name("myBinaryData");
  o->add(p);
  o->factory = this;
  return o;
}